

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_each.cpp
# Opt level: O2

void __thiscall tst_helpers_each::ignoreResult(tst_helpers_each *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_> QVar3;
  bool bVar4;
  PromiseDataBase<void,_void_()> *this_00;
  PromiseData<QList<int>_> *this_01;
  QPromiseReject<QList<int>_> *in_R8;
  initializer_list<int> args;
  initializer_list<int> args_00;
  initializer_list<int> args_01;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_1a0;
  PromiseResolver<QList<int>_> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_190;
  QPromiseBase<void> local_188;
  _Any_data local_178;
  QVector<int> *local_168;
  PromiseData<QList<int>_> *local_160;
  QPromiseBase<QList<int>_> local_158;
  PromiseResolver<void> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_128;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_120;
  QPromise<QList<int>_> p_1;
  QPromise<QList<int>_> p;
  QArrayDataPointer<int> local_f0;
  function<void_()> local_d8;
  QVector<int> values;
  QPromiseBase<QList<int>_> local_98;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_60;
  undefined1 *local_3c;
  undefined4 local_34;
  
  values.d.d = (Data *)0x0;
  values.d.ptr = (int *)0x0;
  values.d.size = 0;
  local_3c = &DAT_2b0000002a;
  local_34 = 0x2c;
  args._M_len = 3;
  args._M_array = (iterator)&local_3c;
  QList<int>::QList((QList<int> *)&local_f0,args);
  QtPromise::QPromise<QList<int>_>::resolve
            ((QPromise<QList<int>_> *)&local_98,(QList<int> *)&local_f0);
  p_1.super_QPromiseBase<QList<int>_>.m_d.d = local_98.m_d.d;
  if (local_98.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((local_98.m_d.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p_1.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0013c4c8
  ;
  local_188._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0013c670;
  this_00 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  ((PromiseDataBase<void,_void_()> *)&this_00->_vptr_PromiseDataBase)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)this_00);
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_00 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_d8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0013c628;
  local_188.m_d.d = (PromiseData<void> *)this_00;
  local_d8.super__Function_base._M_functor._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_d8);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_d8);
  QVar3 = p_1.super_QPromiseBase<QList<int>_>.m_d;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
       (Data *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    local_1a0.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_1a0.d = (Data *)resolver.m_d.d;
  }
  local_190.d = (Data *)0x0;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_1a0.d != (Data *)0x0) {
    LOCK();
    ((local_1a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_1a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_168 = &values;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_178._M_unused._0_8_ = resolver.m_d.d;
  local_178._8_8_ = local_1a0.d;
  local_158._vptr_QPromiseBase = (_func_int **)resolver.m_d.d;
  local_88._M_unused._M_object = operator_new(0x18);
  *(void **)local_88._M_unused._0_8_ = local_178._M_unused._M_object;
  if ((Data *)local_178._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_178._M_unused._0_8_ = *local_178._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_88._M_unused._0_8_ + 8) = local_178._8_8_;
  if ((Data *)local_178._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_178._8_8_ = *(int *)local_178._8_8_ + 1;
    UNLOCK();
  }
  *(QVector<int> **)((long)local_88._M_unused._0_8_ + 0x10) = local_168;
  pcStack_70 = std::
               _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<QList<int>,QtPromise::QPromise<QList<int>>::each<tst_helpers_each::ignoreResult()::$_0>(tst_helpers_each::ignoreResult()::$_0)::{lambda(QList<int>const&)#1}(QList<int>const&)#1},QList<int>const&>
  ::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(QtPromise::QPromise<QList<int>>::each<tst_helpers_each::ignoreResult()::$_0>(tst_helpers_each::ignoreResult()::$_0)::{lambda(QList<int>const&)#1}(QList<int>const&)#1}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(QList<int>const&)#1}::~function((_lambda_QList<int>const___1_ *)local_178._M_pod_data);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addHandler
            (&(QVar3.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>,
             (function<void_(const_QList<int>_&)> *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  QVar3 = p_1.super_QPromiseBase<QList<int>_>.m_d;
  QtPromisePrivate::PromiseCatcher<QList<int>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            (&local_60,(PromiseCatcher<QList<int>,decltype(nullptr),void> *)0x0,&local_158,
             (QPromiseResolve<void> *)&local_1a0,(QPromiseReject<void> *)in_R8);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addCatcher
            (&(QVar3.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>,&local_60);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_1a0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_190);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_158);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &resolver_1);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  local_188._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0013c628;
  bVar4 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                    (&(p_1.super_QPromiseBase<QList<int>_>.m_d.d)->
                      super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::dispatch
              (&(p_1.super_QPromiseBase<QList<int>_>.m_d.d)->
                super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
  }
  local_158.m_d.d = p_1.super_QPromiseBase<QList<int>_>.m_d.d;
  if (p_1.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((p_1.super_QPromiseBase<QList<int>_>.m_d.d)->
              super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_158._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0013c4c8;
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0013c498;
  this_01 = (PromiseData<QList<int>_> *)operator_new(0x68);
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (this_01->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock = 0
  ;
  *(undefined8 *)&(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled
       = 0;
  (this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData = 0;
  (this_01->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<QList<int>_>::PromiseData(this_01);
  LOCK();
  pQVar1 = &(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
            super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_01 != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &(this_01->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_0013c4c8;
  p.super_QPromiseBase<QList<int>_>.m_d.d = this_01;
  QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
            (&resolver_1,(QPromise<QList<int>_> *)&resolver);
  QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase((QPromiseBase<QList<int>_> *)&resolver);
  QVar2.d = local_188.m_d.d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_1a0.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_1a0 = resolver_1.m_d.d;
  }
  local_190.d = (Data *)0x0;
  if (local_1a0.d == (Data *)0x0) {
    local_178._8_8_ = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_1a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_1a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_178._8_8_ = local_1a0.d;
  }
  local_128.d = (Data *)0x0;
  if (local_1a0.d != (Data *)0x0) {
    LOCK();
    ((local_1a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_1a0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((Data *)local_178._8_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_178._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_178._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_160 = local_158.m_d.d;
  if (local_158.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((local_158.m_d.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_168 = (QVector<int> *)&PTR__QPromiseBase_0013c4c8;
  local_d8.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_d8.super__Function_base._M_functor._8_8_ = 0;
  local_d8.super__Function_base._M_manager = (_Manager_type)0x0;
  local_d8._M_invoker = (_Invoker_type)0x0;
  local_178._M_unused._0_8_ = (undefined8)local_1a0.d;
  local_120.d = (Data *)local_178._8_8_;
  local_d8.super__Function_base._M_functor._M_unused._M_object = operator_new(0x20);
  *(void **)local_d8.super__Function_base._M_functor._M_unused._0_8_ = local_178._M_unused._M_object
  ;
  if ((Data *)local_178._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_178._M_unused._0_8_ = *local_178._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_d8.super__Function_base._M_functor._M_unused._0_8_ + 8) =
       local_178._8_8_;
  if ((Data *)local_178._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_178._8_8_ = *(int *)local_178._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_d8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       &PTR__QPromiseBase_0013c498;
  *(PromiseData<QList<int>_> **)
   ((long)local_d8.super__Function_base._M_functor._M_unused._0_8_ + 0x18) = local_160;
  if (local_160 != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &(local_160->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_d8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       &PTR__QPromiseBase_0013c4c8;
  local_d8._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
       ::_M_invoke;
  local_d8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
       ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<void,QtPromise::QPromiseBase<QList<int>>::tap<QtPromise::QPromise<QList<int>>::each<tst_helpers_each::ignoreResult()::$_0>(tst_helpers_each::ignoreResult()::$_0)::{lambda()#1}(QList<int>const&)#1}>(QtPromise::QPromise<QList<int>>::each<tst_helpers_each::ignoreResult()::$_0>(tst_helpers_each::ignoreResult()::$_0)::{lambda()#1}(QList<int>const&)#1})const::{lambda()#1}()#1},void>
  ::
  create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>(QtPromise::QPromiseBase<QList<int>>::tap<QtPromise::QPromise<QList<int>>::each<tst_helpers_each::ignoreResult()::$_0>(tst_helpers_each::ignoreResult()::$_0)::{lambda()#1}(QList<int>const&)#1}>(QtPromise::QPromise<QList<int>>::each<tst_helpers_each::ignoreResult()::$_0>(tst_helpers_each::ignoreResult()::$_0)::{lambda()#1}(QList<int>const&)#1})const::{lambda()#1}()#1}const&,QtPromise::QPromiseResolve<QList<int>>const&,QtPromise::QPromiseReject<QList<int>>const&)
  ::{lambda()#1}::~function((_lambda___1_ *)local_178._M_pod_data);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,&local_d8);
  std::_Function_base::~_Function_base(&local_d8.super__Function_base);
  QVar2.d = local_188.m_d.d;
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_178,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_1a0,
             (QPromiseResolve<QList<int>_> *)&local_120,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_178);
  std::_Function_base::~_Function_base((_Function_base *)&local_178);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_120);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_128);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_1a0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_190);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0013c4c8;
  bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(local_188.m_d.d)->super_PromiseDataBase<void,_void_()>);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              (&(local_188.m_d.d)->super_PromiseDataBase<void,_void_()>);
  }
  QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase(&local_158);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_188);
  QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase(&p_1.super_QPromiseBase<QList<int>_>);
  QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase(&local_98);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_f0);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  waitForValue<QList<int>>((QList<int> *)&local_f0,&p,(QList<int> *)&resolver);
  local_188._vptr_QPromiseBase = (_func_int **)&DAT_2b0000002a;
  local_188.m_d.d._0_4_ = 0x2c;
  args_00._M_len = 3;
  args_00._M_array = (iterator)&local_188;
  QList<int>::QList((QList<int> *)&p_1,args_00);
  bVar4 = QTest::qCompare<int>
                    ((QList<int> *)&local_f0,(QList<int> *)&p_1,"waitForValue(p, QVector<int>{})",
                     "(QVector<int>{42, 43, 44})",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_each.cpp"
                     ,0x54);
  QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&p_1);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_f0);
  QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&resolver);
  if (bVar4) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
         (Data *)0x2c0000002b;
    args_01._M_len = 3;
    args_01._M_array = (iterator)&resolver;
    QList<int>::QList((QList<int> *)&local_f0,args_01);
    QTest::qCompare<int>
              (&values,(QList<int> *)&local_f0,"values","(QVector<int>{43, 44, 45})",
               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_each.cpp"
               ,0x55);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_f0);
  }
  QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase(&p.super_QPromiseBase<QList<int>_>);
  QArrayDataPointer<int>::~QArrayDataPointer(&values.d);
  return;
}

Assistant:

void tst_helpers_each::preserveValues()
{
    QVector<int> values;
    auto p = QtPromise::each(QVector<int>{42, 43, 44}, [&](int v, ...) {
        values << v + 1;
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(waitForValue(p, QVector<int>{}), (QVector<int>{42, 43, 44}));
    QCOMPARE(values, (QVector<int>{43, 44, 45}));
}